

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O3

int jas_image_getfmt(jas_stream_t *in)

{
  _func_int_jas_stream_t_ptr *p_Var1;
  int iVar2;
  int iVar3;
  _func_int_jas_stream_t_ptr **pp_Var4;
  
  if (0 < jas_image_numfmts) {
    pp_Var4 = &jas_image_fmtinfos[0].ops.validate;
    iVar3 = 0;
    do {
      p_Var1 = *pp_Var4;
      if (p_Var1 != (_func_int_jas_stream_t_ptr *)0x0) {
        iVar2 = jas_getdbglevel();
        if (iVar2 < 0x14) {
          iVar2 = (*p_Var1)(in);
          if (iVar2 == 0) goto LAB_0010ff8a;
        }
        else {
          jas_eprintf("testing for format %s ... ",pp_Var4[-5]);
          iVar2 = (**pp_Var4)(in);
          if (iVar2 == 0) {
            jas_eprintf("test succeeded\n");
LAB_0010ff8a:
            return *(int *)(pp_Var4 + -6);
          }
          jas_eprintf("test failed\n");
        }
      }
      iVar3 = iVar3 + 1;
      pp_Var4 = pp_Var4 + 7;
    } while (iVar3 < jas_image_numfmts);
  }
  return -1;
}

Assistant:

int jas_image_getfmt(jas_stream_t *in)
{
	jas_image_fmtinfo_t *fmtinfo;
	int found;
	int i;

	/* Check for data in each of the supported formats. */
	found = 0;
	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i,
	  ++fmtinfo) {
		if (fmtinfo->ops.validate) {
			/* Is the input data valid for this format? */
			JAS_DBGLOG(20, ("testing for format %s ... ", fmtinfo->name));
			if (!(*fmtinfo->ops.validate)(in)) {
				JAS_DBGLOG(20, ("test succeeded\n"));
				found = 1;
				break;
			}
			JAS_DBGLOG(20, ("test failed\n"));
		}
	}
	return found ? fmtinfo->id : (-1);
}